

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse2_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_table_scan_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ushort *puVar1;
  short *psVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  int iVar11;
  uint uVar12;
  parasail_result_t *ppVar13;
  __m128i *ptr;
  int16_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  char *pcVar18;
  uint uVar19;
  long lVar20;
  __m128i *palVar21;
  int32_t segNum;
  uint uVar22;
  long lVar23;
  ulong size;
  int16_t iVar24;
  long lVar25;
  ulong uVar26;
  char *__format;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  bool bVar33;
  undefined4 uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  short sVar42;
  short sVar43;
  undefined1 auVar44 [16];
  short sVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  __m128i alVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  short sVar51;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  undefined1 auVar52 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  undefined1 auVar69 [16];
  undefined1 auVar75 [16];
  ushort uVar76;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  undefined1 auVar77 [16];
  ushort uVar84;
  int local_e8;
  int local_d0;
  long local_b0;
  __m128i_16_t e;
  __m128i_16_t h;
  short sVar34;
  short sVar39;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar18 = "profile";
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar18 = "profile->profile16.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar18 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar18 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar18 = "s2";
        }
        else {
          uVar26 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar18 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar18 = "open";
          }
          else {
            if (-1 < gap) {
              uVar12 = uVar3 - 1;
              size = (ulong)uVar3 + 7 >> 3;
              iVar32 = -open;
              iVar27 = ppVar5->min;
              iVar14 = -iVar27;
              if (iVar27 != iVar32 && SBORROW4(iVar27,iVar32) == iVar27 + open < 0) {
                iVar14 = open;
              }
              iVar11 = ppVar5->max;
              ppVar13 = parasail_result_new_table1((uint)((ulong)uVar3 + 7) & 0x7ffffff8,s2Len);
              if (ppVar13 == (parasail_result_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              iVar15 = (uint)(s1_end != 0) * 0x10;
              ppVar13->flag =
                   iVar15 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                   (uint)(s2_end != 0) << 0xf | ppVar13->flag | 0x8220402;
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              ptr_01 = parasail_memalign___m128i(0x10,size);
              ptr_02 = parasail_memalign___m128i(0x10,size);
              ptr_03 = parasail_memalign___m128i(0x10,size);
              auVar36._0_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0 && (int)ptr == 0);
              auVar36._4_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
              auVar36._8_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0 && (int)ptr_01 == 0);
              auVar36._12_4_ = -(uint)((int)ptr_02 == 0 && (int)((ulong)ptr_02 >> 0x20) == 0);
              iVar15 = movmskps(iVar15,auVar36);
              if (iVar15 != 0) {
                return (parasail_result_t *)0x0;
              }
              if (ptr_03 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              iVar15 = s2Len + -1;
              uVar16 = 7 - (int)(uVar12 / size);
              auVar36 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar35 = auVar36._0_4_;
              auVar46._4_4_ = uVar35;
              auVar46._0_4_ = uVar35;
              auVar46._8_4_ = uVar35;
              auVar46._12_4_ = uVar35;
              auVar36 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
              uVar35 = auVar36._0_4_;
              uVar22 = iVar14 - 0x7fff;
              auVar36 = pshuflw(ZEXT416(uVar22),ZEXT416(uVar22),0);
              auVar37._0_4_ = auVar36._0_4_;
              auVar37._4_4_ = auVar37._0_4_;
              auVar37._8_4_ = auVar37._0_4_;
              auVar37._12_4_ = auVar37._0_4_;
              auVar40 = ZEXT416(CONCAT22((short)((uint)iVar27 >> 0x10),0x7ffe - (short)iVar11));
              auVar41 = pshuflw(auVar40,auVar40,0);
              auVar40._0_4_ = auVar41._0_4_;
              auVar40._4_4_ = auVar40._0_4_;
              auVar40._8_4_ = auVar40._0_4_;
              auVar40._12_4_ = auVar40._0_4_;
              auVar44 = pshuflw(ZEXT416(uVar16),ZEXT416(uVar16),0);
              sVar34 = auVar44._0_2_;
              sVar39 = auVar44._2_2_;
              uVar17 = (uint)size;
              auVar44 = pshuflw(ZEXT416(-(uVar17 * gap)),ZEXT416(-(uVar17 * gap)),0);
              uVar19 = auVar44._0_4_;
              auVar44._0_8_ = CONCAT44(uVar19,uVar19);
              auVar44._8_4_ = uVar19;
              auVar44._12_4_ = uVar19;
              auVar47._0_8_ = auVar44._0_8_ << 0x10;
              auVar47._8_8_ = auVar44._8_8_ << 0x10 | (ulong)(uVar19 >> 0x10);
              auVar44 = paddsw(auVar47,ZEXT416(uVar22 & 0xffff));
              lVar25 = (long)iVar32;
              for (uVar29 = 0; uVar29 != size; uVar29 = uVar29 + 1) {
                lVar30 = lVar25;
                for (lVar23 = 0; lVar23 != 8; lVar23 = lVar23 + 1) {
                  lVar31 = lVar30;
                  if (s1_beg != 0) {
                    lVar31 = 0;
                  }
                  lVar20 = -0x8000;
                  if (-0x8000 < lVar31) {
                    lVar20 = lVar31;
                  }
                  lVar31 = lVar31 - (ulong)(uint)open;
                  if (lVar31 < -0x7fff) {
                    lVar31 = -0x8000;
                  }
                  *(short *)((long)&h + lVar23 * 2) = (short)lVar20;
                  *(short *)((long)&e + lVar23 * 2) = (short)lVar31;
                  lVar30 = lVar30 - size * (uint)gap;
                }
                ptr_02[uVar29][0] = h.m[0];
                ptr_02[uVar29][1] = h.m[1];
                ptr[uVar29][0] = e.m[0];
                ptr[uVar29][1] = e.m[1];
                lVar25 = lVar25 - (ulong)(uint)gap;
              }
              *ptr_00 = 0;
              for (uVar29 = 1; s2Len + 1 != uVar29; uVar29 = uVar29 + 1) {
                iVar24 = -0x8000;
                if (-0x8000 < iVar32) {
                  iVar24 = (int16_t)iVar32;
                }
                if (s2_beg != 0) {
                  iVar24 = 0;
                }
                ptr_00[uVar29] = iVar24;
                iVar32 = iVar32 - gap;
              }
              alVar48 = (__m128i)psubsw((undefined1  [16])0x0,auVar46);
              for (uVar19 = uVar17 - 1; -1 < (int)uVar19; uVar19 = uVar19 - 1) {
                ptr_03[uVar19] = alVar48;
                auVar65._4_4_ = uVar35;
                auVar65._0_4_ = uVar35;
                auVar65._8_4_ = uVar35;
                auVar65._12_4_ = uVar35;
                alVar48 = (__m128i)psubsw((undefined1  [16])alVar48,auVar65);
                sVar43 = (short)alVar48[0];
                sVar42 = auVar40._0_2_;
                auVar61._0_2_ =
                     (ushort)(sVar43 < sVar42) * sVar43 | (ushort)(sVar43 >= sVar42) * sVar42;
                sVar43 = alVar48[0]._2_2_;
                sVar42 = auVar40._2_2_;
                auVar61._2_2_ =
                     (ushort)(sVar43 < sVar42) * sVar43 | (ushort)(sVar43 >= sVar42) * sVar42;
                sVar43 = alVar48[0]._4_2_;
                sVar42 = auVar40._4_2_;
                auVar61._4_2_ =
                     (ushort)(sVar43 < sVar42) * sVar43 | (ushort)(sVar43 >= sVar42) * sVar42;
                sVar43 = alVar48[0]._6_2_;
                sVar42 = auVar40._6_2_;
                auVar61._6_2_ =
                     (ushort)(sVar43 < sVar42) * sVar43 | (ushort)(sVar43 >= sVar42) * sVar42;
                sVar43 = (short)alVar48[1];
                sVar42 = auVar40._8_2_;
                auVar61._8_2_ =
                     (ushort)(sVar43 < sVar42) * sVar43 | (ushort)(sVar43 >= sVar42) * sVar42;
                sVar43 = alVar48[1]._2_2_;
                sVar42 = auVar40._10_2_;
                auVar61._10_2_ =
                     (ushort)(sVar43 < sVar42) * sVar43 | (ushort)(sVar43 >= sVar42) * sVar42;
                sVar43 = alVar48[1]._4_2_;
                sVar42 = auVar40._12_2_;
                sVar45 = auVar40._14_2_;
                auVar61._12_2_ =
                     (ushort)(sVar43 < sVar42) * sVar43 | (ushort)(sVar43 >= sVar42) * sVar42;
                sVar43 = alVar48[1]._6_2_;
                auVar61._14_2_ =
                     (ushort)(sVar43 < sVar45) * sVar43 | (ushort)(sVar43 >= sVar45) * sVar45;
                auVar40 = auVar61;
              }
              palVar21 = ptr_02 + (ulong)uVar12 % size;
              lVar25 = size * uVar26;
              local_b0 = 0;
              uVar29 = 0;
              auVar47 = auVar37;
              auVar52 = auVar37;
              local_e8 = iVar15;
              while (uVar29 != uVar26) {
                uVar10 = ptr_02[uVar17 - 1][0];
                auVar64._8_8_ = ptr_02[uVar17 - 1][1] << 0x10 | uVar10 >> 0x30;
                auVar64._0_8_ = uVar10 << 0x10 | (ulong)(ushort)ptr_00[uVar29];
                iVar27 = ppVar5->mapper[(byte)s2[uVar29]];
                auVar60 = psubsw(auVar37,(undefined1  [16])*ptr_03);
                lVar30 = 0;
                auVar75 = auVar37;
                while( true ) {
                  sVar43 = auVar75._0_2_;
                  sVar42 = auVar75._2_2_;
                  sVar45 = auVar75._4_2_;
                  sVar70 = auVar75._6_2_;
                  sVar71 = auVar75._8_2_;
                  sVar72 = auVar75._10_2_;
                  sVar73 = auVar75._12_2_;
                  sVar74 = auVar75._14_2_;
                  if (size << 4 == lVar30) break;
                  auVar65 = *(undefined1 (*) [16])((long)*ptr_02 + lVar30);
                  auVar7._4_4_ = uVar35;
                  auVar7._0_4_ = uVar35;
                  auVar7._8_4_ = uVar35;
                  auVar7._12_4_ = uVar35;
                  auVar75 = psubsw(*(undefined1 (*) [16])((long)*ptr + lVar30),auVar7);
                  auVar77 = psubsw(auVar65,auVar46);
                  auVar64 = paddsw(auVar64,*(undefined1 (*) [16])
                                            ((long)pvVar4 +
                                            lVar30 + (long)(int)(iVar27 * uVar17) * 0x10));
                  auVar61 = paddsw(auVar60,*(undefined1 (*) [16])((long)*ptr_03 + lVar30));
                  sVar51 = auVar75._0_2_;
                  sVar53 = auVar77._0_2_;
                  uVar76 = (ushort)(sVar53 < sVar51) * sVar51 | (ushort)(sVar53 >= sVar51) * sVar53;
                  sVar51 = auVar75._2_2_;
                  sVar53 = auVar77._2_2_;
                  uVar78 = (ushort)(sVar53 < sVar51) * sVar51 | (ushort)(sVar53 >= sVar51) * sVar53;
                  sVar51 = auVar75._4_2_;
                  sVar53 = auVar77._4_2_;
                  uVar79 = (ushort)(sVar53 < sVar51) * sVar51 | (ushort)(sVar53 >= sVar51) * sVar53;
                  sVar51 = auVar75._6_2_;
                  sVar53 = auVar77._6_2_;
                  uVar80 = (ushort)(sVar53 < sVar51) * sVar51 | (ushort)(sVar53 >= sVar51) * sVar53;
                  sVar51 = auVar75._8_2_;
                  sVar53 = auVar77._8_2_;
                  uVar81 = (ushort)(sVar53 < sVar51) * sVar51 | (ushort)(sVar53 >= sVar51) * sVar53;
                  sVar51 = auVar75._10_2_;
                  sVar53 = auVar77._10_2_;
                  uVar82 = (ushort)(sVar53 < sVar51) * sVar51 | (ushort)(sVar53 >= sVar51) * sVar53;
                  sVar51 = auVar75._12_2_;
                  sVar53 = auVar77._12_2_;
                  sVar54 = auVar77._14_2_;
                  uVar83 = (ushort)(sVar53 < sVar51) * sVar51 | (ushort)(sVar53 >= sVar51) * sVar53;
                  sVar51 = auVar75._14_2_;
                  uVar84 = (ushort)(sVar54 < sVar51) * sVar51 | (ushort)(sVar54 >= sVar51) * sVar54;
                  sVar51 = auVar61._0_2_;
                  auVar75._0_2_ =
                       (ushort)(sVar43 < sVar51) * sVar51 | (ushort)(sVar43 >= sVar51) * sVar43;
                  sVar43 = auVar61._2_2_;
                  auVar75._2_2_ =
                       (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                  sVar43 = auVar61._4_2_;
                  auVar75._4_2_ =
                       (ushort)(sVar45 < sVar43) * sVar43 | (ushort)(sVar45 >= sVar43) * sVar45;
                  sVar43 = auVar61._6_2_;
                  auVar75._6_2_ =
                       (ushort)(sVar70 < sVar43) * sVar43 | (ushort)(sVar70 >= sVar43) * sVar70;
                  sVar43 = auVar61._8_2_;
                  auVar75._8_2_ =
                       (ushort)(sVar71 < sVar43) * sVar43 | (ushort)(sVar71 >= sVar43) * sVar71;
                  sVar43 = auVar61._10_2_;
                  auVar75._10_2_ =
                       (ushort)(sVar72 < sVar43) * sVar43 | (ushort)(sVar72 >= sVar43) * sVar72;
                  sVar43 = auVar61._12_2_;
                  auVar75._12_2_ =
                       (ushort)(sVar73 < sVar43) * sVar43 | (ushort)(sVar73 >= sVar43) * sVar73;
                  sVar43 = auVar61._14_2_;
                  auVar75._14_2_ =
                       (ushort)(sVar74 < sVar43) * sVar43 | (ushort)(sVar74 >= sVar43) * sVar74;
                  sVar43 = auVar64._0_2_;
                  auVar60._0_2_ =
                       (sVar43 < (short)uVar76) * uVar76 |
                       (ushort)(sVar43 >= (short)uVar76) * sVar43;
                  sVar43 = auVar64._2_2_;
                  auVar60._2_2_ =
                       (sVar43 < (short)uVar78) * uVar78 |
                       (ushort)(sVar43 >= (short)uVar78) * sVar43;
                  sVar43 = auVar64._4_2_;
                  auVar60._4_2_ =
                       (sVar43 < (short)uVar79) * uVar79 |
                       (ushort)(sVar43 >= (short)uVar79) * sVar43;
                  sVar43 = auVar64._6_2_;
                  auVar60._6_2_ =
                       (sVar43 < (short)uVar80) * uVar80 |
                       (ushort)(sVar43 >= (short)uVar80) * sVar43;
                  sVar43 = auVar64._8_2_;
                  auVar60._8_2_ =
                       (sVar43 < (short)uVar81) * uVar81 |
                       (ushort)(sVar43 >= (short)uVar81) * sVar43;
                  sVar43 = auVar64._10_2_;
                  auVar60._10_2_ =
                       (sVar43 < (short)uVar82) * uVar82 |
                       (ushort)(sVar43 >= (short)uVar82) * sVar43;
                  sVar43 = auVar64._12_2_;
                  sVar42 = auVar64._14_2_;
                  auVar60._12_2_ =
                       (sVar43 < (short)uVar83) * uVar83 |
                       (ushort)(sVar43 >= (short)uVar83) * sVar43;
                  auVar60._14_2_ =
                       (sVar42 < (short)uVar84) * uVar84 |
                       (ushort)(sVar42 >= (short)uVar84) * sVar42;
                  puVar1 = (ushort *)((long)*ptr + lVar30);
                  *puVar1 = uVar76;
                  puVar1[1] = uVar78;
                  puVar1[2] = uVar79;
                  puVar1[3] = uVar80;
                  puVar1[4] = uVar81;
                  puVar1[5] = uVar82;
                  puVar1[6] = uVar83;
                  puVar1[7] = uVar84;
                  *(undefined1 (*) [16])((long)*ptr_01 + lVar30) = auVar60;
                  lVar30 = lVar30 + 0x10;
                  auVar64 = auVar65;
                }
                auVar62._8_8_ = auVar60._8_8_ << 0x10 | auVar60._0_8_ >> 0x30;
                uVar76 = ptr_00[uVar29 + 1];
                auVar62._0_8_ = auVar60._0_8_ << 0x10 | (ulong)uVar76;
                auVar65 = paddsw((undefined1  [16])*ptr_03,auVar62);
                sVar51 = auVar65._0_2_;
                auVar77._0_2_ =
                     (ushort)(sVar43 < sVar51) * sVar51 | (ushort)(sVar43 >= sVar51) * sVar43;
                sVar43 = auVar65._2_2_;
                auVar77._2_2_ =
                     (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                sVar43 = auVar65._4_2_;
                auVar77._4_2_ =
                     (ushort)(sVar45 < sVar43) * sVar43 | (ushort)(sVar45 >= sVar43) * sVar45;
                sVar43 = auVar65._6_2_;
                auVar77._6_2_ =
                     (ushort)(sVar70 < sVar43) * sVar43 | (ushort)(sVar70 >= sVar43) * sVar70;
                sVar43 = auVar65._8_2_;
                auVar77._8_2_ =
                     (ushort)(sVar71 < sVar43) * sVar43 | (ushort)(sVar71 >= sVar43) * sVar71;
                sVar43 = auVar65._10_2_;
                auVar77._10_2_ =
                     (ushort)(sVar72 < sVar43) * sVar43 | (ushort)(sVar72 >= sVar43) * sVar72;
                sVar43 = auVar65._12_2_;
                auVar77._12_2_ =
                     (ushort)(sVar73 < sVar43) * sVar43 | (ushort)(sVar73 >= sVar43) * sVar73;
                sVar43 = auVar65._14_2_;
                auVar77._14_2_ =
                     (ushort)(sVar74 < sVar43) * sVar43 | (ushort)(sVar74 >= sVar43) * sVar74;
                iVar27 = 6;
                while( true ) {
                  auVar66._0_8_ = auVar77._0_8_ << 0x10;
                  auVar66._8_8_ = auVar77._8_8_ << 0x10 | auVar77._0_8_ >> 0x30;
                  bVar33 = iVar27 == 0;
                  iVar27 = iVar27 + -1;
                  if (bVar33) break;
                  auVar65 = paddsw(auVar66,auVar44);
                  sVar43 = auVar65._0_2_;
                  sVar42 = auVar77._0_2_;
                  auVar69._0_2_ =
                       (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                  sVar43 = auVar65._2_2_;
                  sVar42 = auVar77._2_2_;
                  auVar69._2_2_ =
                       (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                  sVar43 = auVar65._4_2_;
                  sVar42 = auVar77._4_2_;
                  auVar69._4_2_ =
                       (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                  sVar43 = auVar65._6_2_;
                  sVar42 = auVar77._6_2_;
                  auVar69._6_2_ =
                       (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                  sVar43 = auVar65._8_2_;
                  sVar42 = auVar77._8_2_;
                  auVar69._8_2_ =
                       (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                  sVar43 = auVar65._10_2_;
                  sVar42 = auVar77._10_2_;
                  auVar69._10_2_ =
                       (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                  sVar43 = auVar65._12_2_;
                  sVar42 = auVar77._12_2_;
                  sVar45 = auVar77._14_2_;
                  auVar69._12_2_ =
                       (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                  sVar43 = auVar65._14_2_;
                  auVar69._14_2_ =
                       (ushort)(sVar45 < sVar43) * sVar43 | (ushort)(sVar45 >= sVar43) * sVar45;
                  auVar77 = auVar69;
                }
                auVar67 = paddsw(auVar66,ZEXT416(uVar22 & 0xffff));
                sVar43 = auVar67._0_2_;
                auVar63._0_2_ =
                     (ushort)((short)uVar76 < sVar43) * sVar43 | ((short)uVar76 >= sVar43) * uVar76;
                sVar43 = auVar67._2_2_;
                sVar42 = auVar60._0_2_;
                auVar63._2_2_ =
                     (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                sVar43 = auVar67._4_2_;
                sVar42 = auVar60._2_2_;
                auVar63._4_2_ =
                     (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                sVar43 = auVar67._6_2_;
                sVar42 = auVar60._4_2_;
                auVar63._6_2_ =
                     (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                sVar43 = auVar67._8_2_;
                sVar42 = auVar60._6_2_;
                auVar63._8_2_ =
                     (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                sVar43 = auVar67._10_2_;
                sVar42 = auVar60._8_2_;
                auVar63._10_2_ =
                     (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                sVar43 = auVar67._12_2_;
                sVar42 = auVar60._10_2_;
                sVar45 = auVar60._12_2_;
                auVar63._12_2_ =
                     (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                sVar43 = auVar67._14_2_;
                auVar63._14_2_ =
                     (ushort)(sVar45 < sVar43) * sVar43 | (ushort)(sVar45 >= sVar43) * sVar45;
                lVar30 = local_b0;
                for (lVar23 = 0; size << 4 != lVar23; lVar23 = lVar23 + 0x10) {
                  auVar8._4_4_ = uVar35;
                  auVar8._0_4_ = uVar35;
                  auVar8._8_4_ = uVar35;
                  auVar8._12_4_ = uVar35;
                  auVar61 = psubsw(auVar67,auVar8);
                  auVar65 = psubsw(auVar63,auVar46);
                  sVar43 = auVar65._0_2_;
                  sVar42 = auVar61._0_2_;
                  auVar67._0_2_ =
                       (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                  sVar43 = auVar65._2_2_;
                  sVar42 = auVar61._2_2_;
                  auVar67._2_2_ =
                       (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                  sVar43 = auVar65._4_2_;
                  sVar42 = auVar61._4_2_;
                  auVar67._4_2_ =
                       (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                  sVar43 = auVar65._6_2_;
                  sVar42 = auVar61._6_2_;
                  auVar67._6_2_ =
                       (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                  sVar43 = auVar65._8_2_;
                  sVar42 = auVar61._8_2_;
                  auVar67._8_2_ =
                       (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                  sVar43 = auVar65._10_2_;
                  sVar42 = auVar61._10_2_;
                  auVar67._10_2_ =
                       (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                  sVar43 = auVar65._12_2_;
                  sVar42 = auVar61._12_2_;
                  sVar45 = auVar61._14_2_;
                  auVar67._12_2_ =
                       (ushort)(sVar42 < sVar43) * sVar43 | (ushort)(sVar42 >= sVar43) * sVar42;
                  sVar43 = auVar65._14_2_;
                  auVar67._14_2_ =
                       (ushort)(sVar45 < sVar43) * sVar43 | (ushort)(sVar45 >= sVar43) * sVar45;
                  psVar2 = (short *)((long)*ptr_01 + lVar23);
                  sVar43 = *psVar2;
                  sVar42 = psVar2[1];
                  sVar45 = psVar2[2];
                  sVar70 = psVar2[3];
                  sVar71 = psVar2[4];
                  sVar72 = psVar2[5];
                  sVar73 = psVar2[6];
                  sVar74 = psVar2[7];
                  auVar63._0_2_ =
                       (sVar43 < (short)auVar67._0_2_) * auVar67._0_2_ |
                       (ushort)(sVar43 >= (short)auVar67._0_2_) * sVar43;
                  auVar63._2_2_ =
                       (sVar42 < (short)auVar67._2_2_) * auVar67._2_2_ |
                       (ushort)(sVar42 >= (short)auVar67._2_2_) * sVar42;
                  auVar63._4_2_ =
                       (sVar45 < (short)auVar67._4_2_) * auVar67._4_2_ |
                       (ushort)(sVar45 >= (short)auVar67._4_2_) * sVar45;
                  auVar63._6_2_ =
                       (sVar70 < (short)auVar67._6_2_) * auVar67._6_2_ |
                       (ushort)(sVar70 >= (short)auVar67._6_2_) * sVar70;
                  auVar63._8_2_ =
                       (sVar71 < (short)auVar67._8_2_) * auVar67._8_2_ |
                       (ushort)(sVar71 >= (short)auVar67._8_2_) * sVar71;
                  auVar63._10_2_ =
                       (sVar72 < (short)auVar67._10_2_) * auVar67._10_2_ |
                       (ushort)(sVar72 >= (short)auVar67._10_2_) * sVar72;
                  auVar63._12_2_ =
                       (sVar73 < (short)auVar67._12_2_) * auVar67._12_2_ |
                       (ushort)(sVar73 >= (short)auVar67._12_2_) * sVar73;
                  auVar63._14_2_ =
                       (sVar74 < (short)auVar67._14_2_) * auVar67._14_2_ |
                       (ushort)(sVar74 >= (short)auVar67._14_2_) * sVar74;
                  *(undefined1 (*) [16])((long)*ptr_02 + lVar23) = auVar63;
                  sVar43 = auVar40._0_2_;
                  uVar76 = ((short)auVar67._0_2_ < sVar43) * auVar67._0_2_ |
                           (ushort)((short)auVar67._0_2_ >= sVar43) * sVar43;
                  sVar43 = auVar40._2_2_;
                  uVar78 = ((short)auVar67._2_2_ < sVar43) * auVar67._2_2_ |
                           (ushort)((short)auVar67._2_2_ >= sVar43) * sVar43;
                  sVar43 = auVar40._4_2_;
                  uVar79 = ((short)auVar67._4_2_ < sVar43) * auVar67._4_2_ |
                           (ushort)((short)auVar67._4_2_ >= sVar43) * sVar43;
                  sVar43 = auVar40._6_2_;
                  uVar80 = ((short)auVar67._6_2_ < sVar43) * auVar67._6_2_ |
                           (ushort)((short)auVar67._6_2_ >= sVar43) * sVar43;
                  sVar43 = auVar40._8_2_;
                  uVar81 = ((short)auVar67._8_2_ < sVar43) * auVar67._8_2_ |
                           (ushort)((short)auVar67._8_2_ >= sVar43) * sVar43;
                  sVar43 = auVar40._10_2_;
                  uVar82 = ((short)auVar67._10_2_ < sVar43) * auVar67._10_2_ |
                           (ushort)((short)auVar67._10_2_ >= sVar43) * sVar43;
                  sVar43 = auVar40._12_2_;
                  sVar42 = auVar40._14_2_;
                  uVar83 = ((short)auVar67._12_2_ < sVar43) * auVar67._12_2_ |
                           (ushort)((short)auVar67._12_2_ >= sVar43) * sVar43;
                  uVar84 = ((short)auVar67._14_2_ < sVar42) * auVar67._14_2_ |
                           (ushort)((short)auVar67._14_2_ >= sVar42) * sVar42;
                  auVar40._0_2_ =
                       ((short)auVar63._0_2_ < (short)uVar76) * auVar63._0_2_ |
                       ((short)auVar63._0_2_ >= (short)uVar76) * uVar76;
                  auVar40._2_2_ =
                       ((short)auVar63._2_2_ < (short)uVar78) * auVar63._2_2_ |
                       ((short)auVar63._2_2_ >= (short)uVar78) * uVar78;
                  auVar40._4_2_ =
                       ((short)auVar63._4_2_ < (short)uVar79) * auVar63._4_2_ |
                       ((short)auVar63._4_2_ >= (short)uVar79) * uVar79;
                  auVar40._6_2_ =
                       ((short)auVar63._6_2_ < (short)uVar80) * auVar63._6_2_ |
                       ((short)auVar63._6_2_ >= (short)uVar80) * uVar80;
                  auVar40._8_2_ =
                       ((short)auVar63._8_2_ < (short)uVar81) * auVar63._8_2_ |
                       ((short)auVar63._8_2_ >= (short)uVar81) * uVar81;
                  auVar40._10_2_ =
                       ((short)auVar63._10_2_ < (short)uVar82) * auVar63._10_2_ |
                       ((short)auVar63._10_2_ >= (short)uVar82) * uVar82;
                  auVar40._12_2_ =
                       ((short)auVar63._12_2_ < (short)uVar83) * auVar63._12_2_ |
                       ((short)auVar63._12_2_ >= (short)uVar83) * uVar83;
                  auVar40._14_2_ =
                       ((short)auVar63._14_2_ < (short)uVar84) * auVar63._14_2_ |
                       ((short)auVar63._14_2_ >= (short)uVar84) * uVar84;
                  sVar43 = auVar47._0_2_;
                  auVar49._0_2_ =
                       (sVar43 < (short)auVar63._0_2_) * auVar63._0_2_ |
                       (ushort)(sVar43 >= (short)auVar63._0_2_) * sVar43;
                  sVar43 = auVar47._2_2_;
                  auVar49._2_2_ =
                       (sVar43 < (short)auVar63._2_2_) * auVar63._2_2_ |
                       (ushort)(sVar43 >= (short)auVar63._2_2_) * sVar43;
                  sVar43 = auVar47._4_2_;
                  auVar49._4_2_ =
                       (sVar43 < (short)auVar63._4_2_) * auVar63._4_2_ |
                       (ushort)(sVar43 >= (short)auVar63._4_2_) * sVar43;
                  sVar43 = auVar47._6_2_;
                  auVar49._6_2_ =
                       (sVar43 < (short)auVar63._6_2_) * auVar63._6_2_ |
                       (ushort)(sVar43 >= (short)auVar63._6_2_) * sVar43;
                  sVar43 = auVar47._8_2_;
                  auVar49._8_2_ =
                       (sVar43 < (short)auVar63._8_2_) * auVar63._8_2_ |
                       (ushort)(sVar43 >= (short)auVar63._8_2_) * sVar43;
                  sVar43 = auVar47._10_2_;
                  auVar49._10_2_ =
                       (sVar43 < (short)auVar63._10_2_) * auVar63._10_2_ |
                       (ushort)(sVar43 >= (short)auVar63._10_2_) * sVar43;
                  sVar43 = auVar47._12_2_;
                  sVar42 = auVar47._14_2_;
                  auVar49._12_2_ =
                       (sVar43 < (short)auVar63._12_2_) * auVar63._12_2_ |
                       (ushort)(sVar43 >= (short)auVar63._12_2_) * sVar43;
                  auVar49._14_2_ =
                       (sVar42 < (short)auVar63._14_2_) * auVar63._14_2_ |
                       (ushort)(sVar42 >= (short)auVar63._14_2_) * sVar42;
                  piVar6 = ((ppVar13->field_4).rowcols)->score_row;
                  *(int *)((long)piVar6 + lVar30) = (int)(short)auVar63._0_2_;
                  *(int *)((long)piVar6 + lVar25 * 4 + lVar30) = (int)(short)auVar63._2_2_;
                  *(int *)((long)piVar6 + lVar25 * 8 + lVar30) = (int)(short)auVar63._4_2_;
                  *(int *)((long)piVar6 + lVar25 * 0xc + lVar30) = (int)(short)auVar63._6_2_;
                  *(int *)((long)piVar6 + lVar25 * 0x10 + lVar30) = (int)(short)auVar63._8_2_;
                  *(int *)((long)piVar6 + lVar25 * 0x14 + lVar30) = (int)(short)auVar63._10_2_;
                  *(int *)((long)piVar6 + lVar25 * 0x18 + lVar30) = (int)(short)auVar63._12_2_;
                  *(int *)((long)piVar6 + lVar25 * 0x1c + lVar30) = (int)(short)auVar63._14_2_;
                  lVar30 = lVar30 + uVar26 * 4;
                  auVar47 = auVar49;
                }
                sVar43 = (short)(*palVar21)[0];
                sVar42 = *(short *)((long)*palVar21 + 2);
                sVar45 = *(short *)((long)*palVar21 + 4);
                sVar70 = *(short *)((long)*palVar21 + 6);
                sVar71 = (short)(*palVar21)[1];
                sVar72 = *(short *)((long)*palVar21 + 10);
                sVar73 = *(short *)((long)*palVar21 + 0xc);
                sVar74 = *(short *)((long)*palVar21 + 0xe);
                sVar51 = auVar52._0_2_;
                auVar68._0_2_ = -(ushort)(sVar51 < sVar43);
                sVar53 = auVar52._2_2_;
                auVar68._2_2_ = -(ushort)(sVar53 < sVar42);
                sVar54 = auVar52._4_2_;
                auVar68._4_2_ = -(ushort)(sVar54 < sVar45);
                sVar55 = auVar52._6_2_;
                auVar68._6_2_ = -(ushort)(sVar55 < sVar70);
                sVar56 = auVar52._8_2_;
                auVar68._8_2_ = -(ushort)(sVar56 < sVar71);
                sVar57 = auVar52._10_2_;
                auVar68._10_2_ = -(ushort)(sVar57 < sVar72);
                sVar58 = auVar52._12_2_;
                auVar68._12_2_ = -(ushort)(sVar58 < sVar73);
                sVar59 = auVar52._14_2_;
                auVar68._14_2_ = -(ushort)(sVar59 < sVar74);
                auVar9._2_2_ = -(ushort)(sVar39 == 6);
                auVar9._0_2_ = -(ushort)(sVar34 == 7);
                auVar9._4_2_ = -(ushort)(sVar34 == 5);
                auVar9._6_2_ = -(ushort)(sVar39 == 4);
                auVar9._8_2_ = -(ushort)(sVar34 == 3);
                auVar9._10_2_ = -(ushort)(sVar39 == 2);
                auVar9._12_2_ = -(ushort)(sVar34 == 1);
                auVar9._14_2_ = -(ushort)(sVar39 == 0);
                auVar68 = auVar68 & auVar9;
                auVar52._0_2_ =
                     (ushort)(sVar51 < sVar43) * sVar43 | (ushort)(sVar51 >= sVar43) * sVar51;
                auVar52._2_2_ =
                     (ushort)(sVar53 < sVar42) * sVar42 | (ushort)(sVar53 >= sVar42) * sVar53;
                auVar52._4_2_ =
                     (ushort)(sVar54 < sVar45) * sVar45 | (ushort)(sVar54 >= sVar45) * sVar54;
                auVar52._6_2_ =
                     (ushort)(sVar55 < sVar70) * sVar70 | (ushort)(sVar55 >= sVar70) * sVar55;
                auVar52._8_2_ =
                     (ushort)(sVar56 < sVar71) * sVar71 | (ushort)(sVar56 >= sVar71) * sVar56;
                auVar52._10_2_ =
                     (ushort)(sVar57 < sVar72) * sVar72 | (ushort)(sVar57 >= sVar72) * sVar57;
                auVar52._12_2_ =
                     (ushort)(sVar58 < sVar73) * sVar73 | (ushort)(sVar58 >= sVar73) * sVar58;
                auVar52._14_2_ =
                     (ushort)(sVar59 < sVar74) * sVar74 | (ushort)(sVar59 >= sVar74) * sVar59;
                local_d0 = (int)uVar29;
                if ((((((((((((((((auVar68 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar68 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar68 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar68 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar68 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar68 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar68 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar68 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar68 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar68 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar68 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar68 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar68 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar68 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar68[0xf] < '\0') {
                  local_e8 = local_d0;
                }
                local_b0 = local_b0 + 4;
                uVar29 = uVar29 + 1;
              }
              if (s2_end != 0) {
                iVar27 = 0;
                while( true ) {
                  uVar26 = auVar52._0_8_;
                  lVar25 = auVar52._8_8_;
                  if ((int)uVar16 <= iVar27) break;
                  auVar52._0_8_ = uVar26 << 0x10;
                  auVar52._8_8_ = lVar25 << 0x10 | uVar26 >> 0x30;
                  iVar27 = iVar27 + 1;
                }
                uVar22 = (uint)auVar52._14_2_;
              }
              uVar76 = (ushort)uVar22;
              uVar19 = uVar12;
              if (s1_end != 0) {
                uVar26 = 0;
                while( true ) {
                  uVar76 = (ushort)uVar22;
                  if ((uVar17 & 0xfffffff) << 3 == (uint)uVar26) break;
                  uVar28 = ((uint)uVar26 & 7) * uVar17 + ((uint)(uVar26 >> 3) & 0x1fffffff);
                  if ((int)uVar28 < (int)uVar3) {
                    uVar78 = *(ushort *)((long)*ptr_02 + uVar26 * 2);
                    if ((short)uVar76 < (short)uVar78) {
                      uVar22 = (uint)uVar78;
                      uVar19 = uVar28;
                      local_e8 = iVar15;
                    }
                    else {
                      if ((int)uVar19 <= (int)uVar28) {
                        uVar28 = uVar19;
                      }
                      if (local_e8 != iVar15) {
                        uVar28 = uVar19;
                      }
                      if (uVar78 == uVar76) {
                        uVar19 = uVar28;
                      }
                    }
                  }
                  uVar26 = uVar26 + 1;
                }
              }
              if (s2_end == 0 && s1_end == 0) {
                alVar48 = *palVar21;
                iVar27 = 0;
                while( true ) {
                  uVar26 = alVar48[0];
                  lVar25 = alVar48[1];
                  if ((int)uVar16 <= iVar27) break;
                  alVar48[0] = uVar26 << 0x10;
                  alVar48[1] = lVar25 << 0x10 | uVar26 >> 0x30;
                  iVar27 = iVar27 + 1;
                }
                uVar76 = alVar48[1]._6_2_;
                uVar19 = uVar12;
                local_e8 = iVar15;
              }
              sVar34 = auVar36._0_2_;
              auVar38._0_2_ = -(ushort)(auVar40._0_2_ < sVar34);
              sVar39 = auVar36._2_2_;
              auVar38._2_2_ = -(ushort)(auVar40._2_2_ < sVar39);
              auVar38._4_2_ = -(ushort)(auVar40._4_2_ < sVar34);
              auVar38._6_2_ = -(ushort)(auVar40._6_2_ < sVar39);
              auVar38._8_2_ = -(ushort)(auVar40._8_2_ < sVar34);
              auVar38._10_2_ = -(ushort)(auVar40._10_2_ < sVar39);
              auVar38._12_2_ = -(ushort)(auVar40._12_2_ < sVar34);
              auVar38._14_2_ = -(ushort)(auVar40._14_2_ < sVar39);
              sVar34 = auVar41._0_2_;
              auVar50._0_2_ = -(ushort)(sVar34 < auVar47._0_2_);
              sVar39 = auVar41._2_2_;
              auVar50._2_2_ = -(ushort)(sVar39 < auVar47._2_2_);
              auVar50._4_2_ = -(ushort)(sVar34 < auVar47._4_2_);
              auVar50._6_2_ = -(ushort)(sVar39 < auVar47._6_2_);
              auVar50._8_2_ = -(ushort)(sVar34 < auVar47._8_2_);
              auVar50._10_2_ = -(ushort)(sVar39 < auVar47._10_2_);
              auVar50._12_2_ = -(ushort)(sVar34 < auVar47._12_2_);
              auVar50._14_2_ = -(ushort)(sVar39 < auVar47._14_2_);
              auVar50 = auVar50 | auVar38;
              if ((((((((((((((((auVar50 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar50 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar50 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar50 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar50 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar50 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar50 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar50 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar50 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar50 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar50 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar50 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar50[0xf] < '\0') {
                *(byte *)&ppVar13->flag = (byte)ppVar13->flag | 0x40;
                uVar76 = 0;
                local_e8 = 0;
                uVar19 = 0;
              }
              ppVar13->score = (int)(short)uVar76;
              ppVar13->end_query = uVar19;
              ppVar13->end_ref = local_e8;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar13;
            }
            __format = "%s: %s must be >= 0\n";
            pcVar18 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_table_scan_profile_sse2_128_16",pcVar18);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi16(vH, vMaxH));
            vMaxH = _mm_max_epi16(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
        }
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            score = (int16_t) _mm_extract_epi16 (vH, 7);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}